

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_api.c
# Opt level: O0

char * module_file_base(char *module,char sep)

{
  char *__s;
  size_t sVar1;
  int local_24;
  ecs_size_t len;
  ecs_size_t i;
  char *base;
  char sep_local;
  char *module_local;
  
  __s = (*ecs_os_api.strdup_)(module);
  sVar1 = strlen(__s);
  for (local_24 = 0; local_24 < (int)sVar1; local_24 = local_24 + 1) {
    if (__s[local_24] == '.') {
      __s[local_24] = sep;
    }
  }
  return __s;
}

Assistant:

static
char *module_file_base(const char *module, char sep) {
    char *base = ecs_os_strdup(module);
    ecs_size_t i, len = ecs_os_strlen(base);
    for (i = 0; i < len; i ++) {
        if (base[i] == '.') {
            base[i] = sep;
        }
    }

    return base;
}